

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly_invert(POLY_MUL_SCRATCH *scratch,poly *out,poly *in)

{
  uint local_b40;
  uint local_b3c;
  uint i_1;
  uint i;
  poly tmp;
  poly *b;
  poly a;
  poly *in_local;
  poly *out_local;
  POLY_MUL_SCRATCH *scratch_local;
  
  for (local_b3c = 0; local_b3c < 0x2bd; local_b3c = local_b3c + 1) {
    *(uint16_t *)((long)&b + (ulong)local_b3c * 2) = -(in->field_0).v[local_b3c];
  }
  poly_normalize((poly *)&b);
  poly_invert_mod2(out,in);
  for (local_b40 = 0; local_b40 < 4; local_b40 = local_b40 + 1) {
    poly_mul(scratch,(poly *)&i_1,(poly *)&b,out);
    i_1._0_2_ = (short)i_1 + 2;
    poly_mul(scratch,out,out,(poly *)&i_1);
  }
  poly_assert_normalized(out);
  return;
}

Assistant:

static void poly_invert(struct POLY_MUL_SCRATCH *scratch, struct poly *out,
                        const struct poly *in) {
  // Inversion mod Q, which is done based on the result of inverting mod
  // 2. See [NTRUTN14] paper, bottom of page two.
  struct poly a, *b, tmp;

  // a = -in.
  for (unsigned i = 0; i < N; i++) {
    a.v[i] = -in->v[i];
  }
  poly_normalize(&a);

  // b = in^-1 mod 2.
  b = out;
  poly_invert_mod2(b, in);

  // We are working mod Q=2**13 and we need to iterate ceil(log_2(13))
  // times, which is four.
  for (unsigned i = 0; i < 4; i++) {
    poly_mul(scratch, &tmp, &a, b);
    tmp.v[0] += 2;
    poly_mul(scratch, b, b, &tmp);
  }

  poly_assert_normalized(out);
}